

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldMap.h
# Opt level: O3

FieldMap * __thiscall FIX::FieldMap::getGroupRef(FieldMap *this,int num,int tag)

{
  _Base_ptr p_Var1;
  FieldNotFound *pFVar2;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  string local_48;
  
  p_Var3 = (this->m_groups)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var3 != (_Base_ptr)0x0) {
    p_Var4 = &(this->m_groups)._M_t._M_impl.super__Rb_tree_header;
    p_Var1 = &p_Var4->_M_header;
    do {
      if (tag <= (int)p_Var3[1]._M_color) {
        p_Var1 = p_Var3;
      }
      p_Var3 = (&p_Var3->_M_left)[(int)p_Var3[1]._M_color < tag];
    } while (p_Var3 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var1 != p_Var4) && ((int)p_Var1[1]._M_color <= tag)) {
      if (num < 1) {
        pFVar2 = (FieldNotFound *)__cxa_allocate_exception(0x58);
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"");
        FieldNotFound::FieldNotFound(pFVar2,tag,&local_48);
        __cxa_throw(pFVar2,&FieldNotFound::typeinfo,FIX::Exception::~Exception);
      }
      if ((ulong)(uint)num <= (ulong)((long)p_Var1[1]._M_left - (long)p_Var1[1]._M_parent >> 3)) {
        return *(FieldMap **)((long)p_Var1[1]._M_parent + (ulong)(uint)num * 8 + -8);
      }
      pFVar2 = (FieldNotFound *)__cxa_allocate_exception(0x58);
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"");
      FieldNotFound::FieldNotFound(pFVar2,tag,&local_48);
      __cxa_throw(pFVar2,&FieldNotFound::typeinfo,FIX::Exception::~Exception);
    }
  }
  pFVar2 = (FieldNotFound *)__cxa_allocate_exception(0x58);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"");
  FieldNotFound::FieldNotFound(pFVar2,tag,&local_48);
  __cxa_throw(pFVar2,&FieldNotFound::typeinfo,FIX::Exception::~Exception);
}

Assistant:

FieldMap& getGroupRef( int num, int tag ) const
  EXCEPT ( FieldNotFound )
  {
    Groups::const_iterator i = m_groups.find( tag );
    if( i == m_groups.end() ) throw FieldNotFound( tag );
    if( num <= 0 ) throw FieldNotFound( tag );
    if( i->second.size() < (unsigned)num ) throw FieldNotFound( tag );
    return *( *(i->second.begin() + (num-1) ) );
  }